

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<void_*>,_kj::Own<capnp::ClientHook>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++:718:15),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<void_*>,_kj::Own<capnp::ClientHook>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:718:15),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::Promise<void_*>_> *pEVar1;
  Own<capnp::ClientHook> *in_00;
  Promise<void_*> local_600;
  ExceptionOr<kj::Promise<void_*>_> local_5f0;
  Own<capnp::ClientHook> *local_478;
  Own<capnp::ClientHook> *depValue;
  ExceptionOr<kj::Promise<void_*>_> local_318;
  Exception *local_1a0;
  Exception *depException;
  undefined1 local_188 [8];
  ExceptionOr<kj::Own<capnp::ClientHook>_> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::Promise<void_*>,_kj::Own<capnp::ClientHook>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:718:15),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr.ptr = (ClientHook *)output;
  ExceptionOr<kj::Own<capnp::ClientHook>_>::ExceptionOr
            ((ExceptionOr<kj::Own<capnp::ClientHook>_> *)local_188);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_188);
  local_1a0 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_188);
  if (local_1a0 == (Exception *)0x0) {
    local_478 = readMaybe<capnp::ClientHook>
                          ((Maybe<kj::Own<capnp::ClientHook>_> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_478 != (Own<capnp::ClientHook> *)0x0) {
      in_00 = mv<kj::Own<capnp::ClientHook>>(local_478);
      MaybeVoidCaller<kj::Own<capnp::ClientHook>,kj::Promise<void*>>::
      apply<capnp::_::CapabilityServerSetBase::getLocalServerInternal(capnp::Capability::Client&)::__0>
                ((MaybeVoidCaller<kj::Own<capnp::ClientHook>,kj::Promise<void*>> *)&local_600,
                 &this->func,in_00);
      handle(&local_5f0,this,&local_600);
      pEVar1 = ExceptionOrValue::as<kj::Promise<void*>>((ExceptionOrValue *)depResult.value.ptr.ptr)
      ;
      ExceptionOr<kj::Promise<void_*>_>::operator=(pEVar1,&local_5f0);
      ExceptionOr<kj::Promise<void_*>_>::~ExceptionOr(&local_5f0);
      Promise<void_*>::~Promise(&local_600);
    }
  }
  else {
    in = mv<kj::Exception>(local_1a0);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x28,in)
    ;
    handle(&local_318,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::Promise<void*>>((ExceptionOrValue *)depResult.value.ptr.ptr);
    ExceptionOr<kj::Promise<void_*>_>::operator=(pEVar1,&local_318);
    ExceptionOr<kj::Promise<void_*>_>::~ExceptionOr(&local_318);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<kj::Own<capnp::ClientHook>_>::~ExceptionOr
            ((ExceptionOr<kj::Own<capnp::ClientHook>_> *)local_188);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }